

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O3

base_learner * scorer_setup(options_i *options,vw *all)

{
  int iVar1;
  scorer *psVar2;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  base_learner *l;
  single_learner *psVar3;
  learner<scorer,_example> *l_00;
  vw_exception *this;
  code *pcVar4;
  undefined4 uVar5;
  code *pcVar6;
  code *pcVar7;
  string link;
  size_type __dnew;
  option_group_definition new_options;
  stringstream __msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  vw *local_2a0;
  long local_298;
  option_group_definition local_290;
  long *local_258;
  long local_250;
  long local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  undefined6 *local_1f8;
  undefined8 local_1f0;
  undefined6 local_1e8;
  undefined2 uStack_1e2;
  undefined6 uStack_1e0;
  undefined1 local_1da;
  string local_1d8;
  undefined1 local_1b8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  psVar2 = calloc_or_throw<scorer>(1);
  psVar2->all = (vw *)0x0;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  uStack_1e0 = 0x736e6f697470;
  local_1e8 = 0x7265726f6373;
  uStack_1e2 = 0x6f20;
  local_1f0 = 0xe;
  local_1da = 0;
  local_290.m_name._M_dataplus._M_p = (pointer)&local_290.m_name.field_2;
  local_1f8 = &local_1e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_290,&local_1e8);
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  local_218.field_2._M_allocated_capacity._0_4_ = 0x6b6e696c;
  local_218._M_string_length = 4;
  local_218.field_2._M_local_buf[4] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,&local_218,&local_2c0);
  local_238.field_2._M_allocated_capacity = 0x797469746e656469;
  local_238._M_string_length = 8;
  local_238.field_2._M_local_buf[8] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  op = VW::config::
       typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::default_value((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1b8,&local_238);
  (op->super_base_option).m_keep = true;
  local_298 = 0x3e;
  local_258 = local_248;
  local_258 = (long *)std::__cxx11::string::_M_create((ulong *)&local_258,(ulong)&local_298);
  local_248[0] = local_298;
  builtin_strncpy((char *)((long)local_258 + 0x2e)," glf1 or",8);
  builtin_strncpy((char *)((long)local_258 + 0x36)," poisson",8);
  local_258[4] = 0x676f6c202c797469;
  local_258[5] = 0x67202c6369747369;
  local_258[2] = 0x6f6974636e756620;
  local_258[3] = 0x746e656469203a6e;
  *local_258 = 0x2079666963657053;
  local_258[1] = 0x6b6e696c20656874;
  local_250 = local_298;
  *(char *)((long)local_258 + local_298) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_290,op);
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d6158;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_290);
  psVar2->all = all;
  l = setup_base(options,all);
  psVar3 = LEARNER::as_singleline<char,char>(l);
  iVar1 = std::__cxx11::string::compare((char *)&local_2c0);
  local_2a0 = all;
  if (iVar1 == 0) {
    uVar5 = *(undefined4 *)(psVar3 + 0xd0);
    l_00 = calloc_or_throw<LEARNER::learner<scorer,example>>(1);
    pcVar6 = multipredict<&(id(float))>;
    pcVar4 = predict_or_learn<false,&(id(float))>;
    pcVar7 = predict_or_learn<true,&(id(float))>;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_2c0);
    if (iVar1 == 0) {
      uVar5 = *(undefined4 *)(psVar3 + 0xd0);
      l_00 = calloc_or_throw<LEARNER::learner<scorer,example>>(1);
      pcVar6 = multipredict<&(logistic(float))>;
      pcVar4 = predict_or_learn<false,&(logistic(float))>;
      pcVar7 = predict_or_learn<true,&(logistic(float))>;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_2c0);
      if (iVar1 == 0) {
        uVar5 = *(undefined4 *)(psVar3 + 0xd0);
        l_00 = calloc_or_throw<LEARNER::learner<scorer,example>>(1);
        pcVar6 = multipredict<&(glf1(float))>;
        pcVar4 = predict_or_learn<false,&(glf1(float))>;
        pcVar7 = predict_or_learn<true,&(glf1(float))>;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_2c0);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"Unknown link function: ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_2c0._M_dataplus._M_p,
                     local_2c0._M_string_length);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/scorer.cc"
                     ,0x5c,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        uVar5 = *(undefined4 *)(psVar3 + 0xd0);
        l_00 = calloc_or_throw<LEARNER::learner<scorer,example>>(1);
        pcVar6 = multipredict<&expf>;
        pcVar4 = predict_or_learn<false,&expf>;
        pcVar7 = predict_or_learn<true,&expf>;
      }
    }
  }
  memcpy(l_00,psVar3,0xe9);
  *(single_learner **)(l_00 + 0x20) = psVar3;
  *(code **)(l_00 + 0x50) = LEARNER::recur_sensitivity;
  *(scorer **)(l_00 + 0xb8) = psVar2;
  *(single_learner **)(l_00 + 0xc0) = psVar3;
  *(code **)(l_00 + 200) = LEARNER::noop;
  *(undefined8 *)(l_00 + 0xd8) = 1;
  *(undefined8 *)(l_00 + 0xe0) = *(undefined8 *)(psVar3 + 0xe0);
  *(scorer **)(l_00 + 0x18) = psVar2;
  *(code **)(l_00 + 0x28) = pcVar7;
  *(code **)(l_00 + 0x30) = pcVar4;
  *(undefined4 *)(l_00 + 0xd0) = uVar5;
  l_00[0xe8] = (learner<scorer,_example>)0x0;
  *(code **)(l_00 + 0x40) = pcVar6;
  *(code **)(l_00 + 0x38) = update;
  psVar3 = LEARNER::as_singleline<scorer,example>(l_00);
  local_2a0->scorer = psVar3;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_290.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_name._M_dataplus._M_p != &local_290.m_name.field_2) {
    operator_delete(local_290.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  return (base_learner *)psVar3;
}

Assistant:

LEARNER::base_learner* scorer_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<scorer>();
  string link;
  option_group_definition new_options("scorer options");
  new_options.add(make_option("link", link)
                      .default_value("identity")
                      .keep()
                      .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  // This always returns a base_learner.

  s->all = &all;

  auto base = as_singleline(setup_base(options, all));
  LEARNER::learner<scorer, example>* l;
  void (*multipredict_f)(scorer&, LEARNER::single_learner&, example&, size_t, size_t, polyprediction*, bool) =
      multipredict<id>;

  if (link.compare("identity") == 0)
    l = &init_learner(s, base, predict_or_learn<true, id>, predict_or_learn<false, id>);
  else if (link.compare("logistic") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, logistic>, predict_or_learn<false, logistic>);
    multipredict_f = multipredict<logistic>;
  }
  else if (link.compare("glf1") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, glf1>, predict_or_learn<false, glf1>);
    multipredict_f = multipredict<glf1>;
  }
  else if (link.compare("poisson") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, expf>, predict_or_learn<false, expf>);
    multipredict_f = multipredict<expf>;
  }
  else
    THROW("Unknown link function: " << link);

  l->set_multipredict(multipredict_f);
  l->set_update(update);
  all.scorer = LEARNER::as_singleline(l);

  return make_base(*all.scorer);
}